

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

_Bool art_internal_validate_at(art_node_t *node,art_internal_validate_t validator)

{
  art_internal_validate_t validator_00;
  art_internal_validate_t validator_01;
  art_internal_validate_t validator_02;
  _Bool _Var1;
  int iVar2;
  art_node_t *in_RDI;
  undefined8 unaff_retaddr;
  art_node48_t *in_stack_00000008;
  art_internal_validate_t in_stack_00000020;
  art_inner_node_t *inner_node;
  art_leaf_t *leaf;
  undefined8 in_stack_ffffffffffffffa8;
  undefined2 uVar3;
  art_key_chunk_t *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  uint8_t key1_from;
  art_key_chunk_t *in_stack_ffffffffffffffc0;
  art_node256_t *node_00;
  art_node_t *paVar4;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  key1_from = (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  uVar3 = (undefined2)((ulong)in_stack_ffffffffffffffa8 >> 0x30);
  node_00 = (art_node256_t *)&stack0x00000008;
  if (in_RDI == (art_node_t *)0x0) {
    _Var1 = art_validate_fail((art_internal_validate_t *)node_00,"node is null");
    return _Var1;
  }
  _Var1 = art_is_leaf(in_RDI);
  if (_Var1) {
    iVar2 = art_compare_prefix(in_stack_ffffffffffffffc0,key1_from,in_stack_ffffffffffffffb0,
                               (uint8_t)((ushort)uVar3 >> 8),(uint8_t)uVar3);
    if (iVar2 != 0) {
      _Var1 = art_validate_fail((art_internal_validate_t *)node_00,
                                "leaf key does not match its position\'s prefix in the tree");
      return _Var1;
    }
    if ((*(art_validate_cb_t *)&node_00->count != (art_validate_cb_t)0x0) &&
       (_Var1 = (**(art_validate_cb_t *)&node_00->count)
                          ((art_val_t *)((ulong)in_RDI & 0xfffffffffffffffe),*(char ***)node_00),
       !_Var1)) {
      if (**(long **)node_00 == 0) {
        **(undefined8 **)node_00 = "leaf validation failed";
      }
      return false;
    }
  }
  else {
    if (6 < (int)(*(int *)node_00->children + (uint)(byte)in_RDI[1] + 1)) {
      _Var1 = art_validate_fail((art_internal_validate_t *)node_00,
                                "node has too much prefix at given depth");
      return _Var1;
    }
    paVar4 = in_RDI;
    memcpy((void *)((long)node_00->children + (long)*(int *)node_00->children + 4),in_RDI + 2,
           (ulong)(byte)in_RDI[1]);
    *(uint *)node_00->children = *(int *)node_00->children + (uint)(byte)in_RDI[1];
    switch(*in_RDI) {
    case (art_node_t)0x0:
      validator_00.validate_cb._0_7_ = in_stack_fffffffffffffff8;
      validator_00.reason = (char **)paVar4;
      validator_00.validate_cb._7_1_ = in_stack_ffffffffffffffff;
      validator_00._24_8_ = in_stack_00000008;
      validator_00._16_8_ = unaff_retaddr;
      _Var1 = art_node4_internal_validate((art_node4_t *)node_00,validator_00);
      if (!_Var1) {
        return false;
      }
      break;
    case (art_node_t)0x1:
      validator_01.validate_cb._0_7_ = in_stack_fffffffffffffff8;
      validator_01.reason = (char **)paVar4;
      validator_01.validate_cb._7_1_ = in_stack_ffffffffffffffff;
      validator_01._24_8_ = in_stack_00000008;
      validator_01._16_8_ = unaff_retaddr;
      _Var1 = art_node16_internal_validate((art_node16_t *)node_00,validator_01);
      if (!_Var1) {
        return false;
      }
      break;
    case (art_node_t)0x2:
      _Var1 = art_node48_internal_validate(in_stack_00000008,in_stack_00000020);
      if (!_Var1) {
        return false;
      }
      break;
    case (art_node_t)0x3:
      validator_02.validate_cb._0_7_ = in_stack_fffffffffffffff8;
      validator_02.reason = (char **)paVar4;
      validator_02.validate_cb._7_1_ = in_stack_ffffffffffffffff;
      validator_02._24_8_ = in_stack_00000008;
      validator_02._16_8_ = unaff_retaddr;
      _Var1 = art_node256_internal_validate(node_00,validator_02);
      if (!_Var1) {
        return false;
      }
      break;
    default:
      _Var1 = art_validate_fail((art_internal_validate_t *)node_00,"invalid node type");
      return _Var1;
    }
  }
  return true;
}

Assistant:

static bool art_internal_validate_at(const art_node_t *node,
                                     art_internal_validate_t validator) {
    if (node == NULL) {
        return art_validate_fail(&validator, "node is null");
    }
    if (art_is_leaf(node)) {
        art_leaf_t *leaf = CAST_LEAF(node);
        if (art_compare_prefix(leaf->key, 0, validator.current_key, 0,
                               validator.depth) != 0) {
            return art_validate_fail(
                &validator,
                "leaf key does not match its position's prefix in the tree");
        }
        if (validator.validate_cb != NULL &&
            !validator.validate_cb(leaf, validator.reason)) {
            if (*validator.reason == NULL) {
                *validator.reason = "leaf validation failed";
            }
            return false;
        }
    } else {
        art_inner_node_t *inner_node = (art_inner_node_t *)node;

        if (validator.depth + inner_node->prefix_size + 1 > ART_KEY_BYTES) {
            return art_validate_fail(&validator,
                                     "node has too much prefix at given depth");
        }
        memcpy(validator.current_key + validator.depth, inner_node->prefix,
               inner_node->prefix_size);
        validator.depth += inner_node->prefix_size;

        switch (inner_node->typecode) {
            case ART_NODE4_TYPE:
                if (!art_node4_internal_validate((art_node4_t *)inner_node,
                                                 validator)) {
                    return false;
                }
                break;
            case ART_NODE16_TYPE:
                if (!art_node16_internal_validate((art_node16_t *)inner_node,
                                                  validator)) {
                    return false;
                }
                break;
            case ART_NODE48_TYPE:
                if (!art_node48_internal_validate((art_node48_t *)inner_node,
                                                  validator)) {
                    return false;
                }
                break;
            case ART_NODE256_TYPE:
                if (!art_node256_internal_validate((art_node256_t *)inner_node,
                                                   validator)) {
                    return false;
                }
                break;
            default:
                return art_validate_fail(&validator, "invalid node type");
        }
    }
    return true;
}